

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpHeaders::Response> * __thiscall
kj::HttpHeaders::tryParseResponse
          (Maybe<kj::HttpHeaders::Response> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  char *end_00;
  NullableValue<kj::StringPtr> *other;
  StringPtr *pSVar2;
  NullableValue<unsigned_int> *other_00;
  uint *puVar3;
  uint *puVar4;
  StringPtr SVar5;
  ArrayPtr<char> content_00;
  char *local_d8;
  char *local_d0;
  Maybe<unsigned_int> local_c4;
  NullableValue<unsigned_int> local_bc;
  NullableValue<unsigned_int> code;
  Maybe<kj::StringPtr> local_90;
  undefined1 local_78 [8];
  NullableValue<kj::StringPtr> version;
  Response response;
  char *ptr;
  char *end;
  HttpHeaders *this_local;
  ArrayPtr<char> content_local;
  
  content_local.ptr = (char *)content.size_;
  content_00.size_ = (HttpHeaders *)content.ptr;
  content_00.ptr = content_local.ptr;
  this_local = content_00.size_;
  content_local.size_ = (size_t)__return_storage_ptr__;
  end_00 = trimHeaderEnding((kj *)content_00.size_,content_00);
  if (end_00 == (char *)0x0) {
    Maybe<kj::HttpHeaders::Response>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    response.statusText.content.size_ = (size_t)ArrayPtr<char>::begin((ArrayPtr<char> *)&this_local)
    ;
    Response::Response((Response *)&version.field_1.value.content.size_);
    consumeWord(&local_90,(char **)&response.statusText.content.size_);
    other = _::readMaybe<kj::StringPtr>(&local_90);
    _::NullableValue<kj::StringPtr>::NullableValue((NullableValue<kj::StringPtr> *)local_78,other);
    Maybe<kj::StringPtr>::~Maybe(&local_90);
    pSVar2 = _::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_78);
    if (pSVar2 == (StringPtr *)0x0) {
      Maybe<kj::HttpHeaders::Response>::Maybe(__return_storage_ptr__,(void *)0x0);
      code.isSet = true;
      code._1_3_ = 0;
    }
    else {
      pSVar2 = _::NullableValue<kj::StringPtr>::operator->((NullableValue<kj::StringPtr> *)local_78)
      ;
      StringPtr::StringPtr((StringPtr *)&code.field_1,"HTTP/");
      bVar1 = StringPtr::startsWith(pSVar2,(StringPtr *)&code.field_1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        code.isSet = false;
        code._1_3_ = 0;
      }
      else {
        Maybe<kj::HttpHeaders::Response>::Maybe(__return_storage_ptr__,(void *)0x0);
        code.isSet = true;
        code._1_3_ = 0;
      }
    }
    _::NullableValue<kj::StringPtr>::~NullableValue((NullableValue<kj::StringPtr> *)local_78);
    if (code._0_4_ == 0) {
      consumeNumber((kj *)&local_c4,(char **)&response.statusText.content.size_);
      other_00 = _::readMaybe<unsigned_int>(&local_c4);
      _::NullableValue<unsigned_int>::NullableValue(&local_bc,other_00);
      Maybe<unsigned_int>::~Maybe(&local_c4);
      puVar3 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_bc);
      if (puVar3 == (uint *)0x0) {
        Maybe<kj::HttpHeaders::Response>::Maybe(__return_storage_ptr__,(void *)0x0);
      }
      else {
        puVar4 = _::NullableValue<unsigned_int>::operator*(&local_bc);
        version.field_1.value.content.size_._0_4_ = *puVar4;
      }
      code._1_3_ = 0;
      code.isSet = puVar3 == (uint *)0x0;
      _::NullableValue<unsigned_int>::~NullableValue(&local_bc);
      if (code._0_4_ == 0) {
        SVar5 = consumeLine((char **)&response.statusText.content.size_);
        local_d8 = SVar5.content.ptr;
        response._0_8_ = local_d8;
        local_d0 = (char *)SVar5.content.size_;
        response.statusText.content.ptr = local_d0;
        bVar1 = parseHeaders(this,(char *)response.statusText.content.size_,end_00);
        if (bVar1) {
          Maybe<kj::HttpHeaders::Response>::Maybe
                    (__return_storage_ptr__,(Response *)&version.field_1.value.content.size_);
        }
        else {
          Maybe<kj::HttpHeaders::Response>::Maybe(__return_storage_ptr__,(void *)0x0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Response> HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_MAYBE(version, consumeWord(ptr)) {
    if (!version->startsWith("HTTP/")) return nullptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(code, consumeNumber(ptr)) {
    response.statusCode = *code;
  } else {
    return nullptr;
  }

  response.statusText = consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return response;
}